

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O0

file_id * idx2::ConstructFilePath
                    (file_id *__return_storage_ptr__,idx2_file *Idx2,u64 Brick,i8 Level,i8 Subband,
                    i16 BpKey)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long *in_FS_OFFSET;
  byte local_229;
  u64 FileId;
  int Written_3;
  int Written_2;
  int BitLen;
  int Depth;
  int Written_1;
  int Written;
  printer Pr;
  int Shift;
  u64 BrickBackup;
  i16 BpKey_local;
  i8 Subband_local;
  u64 uStack_158;
  i8 Level_local;
  u64 Brick_local;
  idx2_file *Idx2_local;
  unsigned_long Result_1;
  unsigned_long Mask_1;
  int Shift_2;
  int S_1;
  unsigned_long Result;
  unsigned_long Mask;
  int Shift_1;
  int S;
  i8 I;
  
  Pr.File._4_4_ = 0;
  printer::printer((printer *)&Written_1,(char *)(*in_FS_OFFSET + -0x580),0x100);
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x60,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    fprintf((FILE *)Pr._8_8_,"%.*s/%s/%s/",(ulong)(uint)(Idx2->Dir).Size,(Idx2->Dir).field_0.Ptr,
            Idx2,Idx2->Field);
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x60,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    iVar4 = snprintf(_Written_1,(long)(int)Pr.Buf,"%.*s/%s/%s/",(ulong)(uint)(Idx2->Dir).Size,
                     (Idx2->Dir).field_0.Ptr,Idx2,Idx2->Field);
    _Written_1 = _Written_1 + iVar4;
    if ((int)Pr.Buf <= iVar4) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x60,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    Pr.Buf._0_4_ = (int)Pr.Buf - iVar4;
  }
  if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
    if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
      __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x61,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    fprintf((FILE *)Pr._8_8_,"/L%02x",(ulong)(uint)(int)Level);
  }
  else {
    if ((int)Pr.Buf < 2) {
      __assert_fail("false && \"buffer too small\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x61,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    iVar4 = snprintf(_Written_1,(long)(int)Pr.Buf,"/L%02x",(ulong)(uint)(int)Level);
    _Written_1 = _Written_1 + iVar4;
    if ((int)Pr.Buf <= iVar4) {
      __assert_fail("false && \"buffer overflow?\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                    ,0x61,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
    }
    Pr.Buf._0_4_ = (int)Pr.Buf - iVar4;
  }
  Written_2 = 0;
  uStack_158 = Brick;
  while( true ) {
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
                   );
    }
    if ((int)(uint)(Idx2->FilesDirsDepth).Arr[(int)Level].Len <= Written_2 + 1) {
      if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
        if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
          __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                        ,99,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
        }
        fprintf((FILE *)Pr._8_8_,".bin");
      }
      else {
        if ((int)Pr.Buf < 2) {
          __assert_fail("false && \"buffer too small\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                        ,99,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
        }
        iVar4 = snprintf(_Written_1,(long)(int)Pr.Buf,".bin");
        _Written_1 = _Written_1 + iVar4;
        if ((int)Pr.Buf <= iVar4) {
          __assert_fail("false && \"buffer overflow?\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                        ,99,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
        }
        Pr.Buf._0_4_ = (int)Pr.Buf - iVar4;
      }
      if (0xf < Level) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
      }
      uVar5 = (ulong)(Idx2->BricksPerFile).Arr[(int)Level];
      if (uVar5 == 0) {
        local_229 = 0xff;
      }
      else {
        lVar1 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        local_229 = 0x3f - ((byte)lVar1 ^ 0x3f);
      }
      (__return_storage_ptr__->Name).field_0.Ptr = (str)(*in_FS_OFFSET + -0x580);
      (__return_storage_ptr__->Name).Size = (int)Pr.Buf;
      __return_storage_ptr__->Id =
           ((long)Level << 0x3c) +
           (Brick >> (local_229 + (uVar5 != 1L << (local_229 & 0x3f)) & 0x3f)) * 0x40000;
      return __return_storage_ptr__;
    }
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
                   );
    }
    if (3 < Written_2) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]"
                   );
    }
    cVar2 = ('@' - (Idx2->BricksOrderStr).Buffer.Data[(long)Level * 0x81 + 0x80]) +
            (Idx2->FilesDirsDepth).Arr[(int)Level].Arr[Written_2];
    if ((_Written_1 == (char *)0x0) || (Pr._8_8_ != 0)) {
      if ((_Written_1 != (char *)0x0) || (Pr._8_8_ == 0)) {
        __assert_fail("false && \"unavailable or ambiguous printer destination\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                      ,0x62,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
      }
      bVar3 = 0x40 - cVar2;
      fprintf((FILE *)Pr._8_8_,"/B%lx",(uStack_158 & -1L << (bVar3 & 0x3f)) >> (bVar3 & 0x3f));
    }
    else {
      if ((int)Pr.Buf < 2) {
        __assert_fail("false && \"buffer too small\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                      ,0x62,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
      }
      bVar3 = 0x40 - cVar2;
      iVar4 = snprintf(_Written_1,(long)(int)Pr.Buf,"/B%lx",
                       (uStack_158 & -1L << (bVar3 & 0x3f)) >> (bVar3 & 0x3f));
      _Written_1 = _Written_1 + iVar4;
      if ((int)Pr.Buf <= iVar4) {
        __assert_fail("false && \"buffer overflow?\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Lookup.cpp"
                      ,0x62,"file_id idx2::ConstructFilePath(const idx2_file &, u64, i8, i8, i16)");
      }
      Pr.Buf._0_4_ = (int)Pr.Buf - iVar4;
    }
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
                   );
    }
    if (3 < Written_2) break;
    uStack_158 = uStack_158 << ((Idx2->FilesDirsDepth).Arr[(int)Level].Arr[Written_2] & 0x3fU);
    if (0xf < Level) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::stack_array<signed char, 4>, 16>::operator[](int) const [t = idx2::stack_array<signed char, 4>, N = 16]"
                   );
    }
    if (3 < Written_2) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]"
                   );
    }
    Pr.File._4_4_ = (Idx2->FilesDirsDepth).Arr[(int)Level].Arr[Written_2] + Pr.File._4_4_;
    Written_2 = Written_2 + 1;
  }
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,
                "t &idx2::stack_array<signed char, 4>::operator[](int) const [t = signed char, N = 4]"
               );
}

Assistant:

file_id
ConstructFilePath(const idx2_file& Idx2, u64 Brick, i8 Level, i8 Subband, i16 BpKey)
{
  //i16 BpFileKey = (BpKey * Idx2.BitPlanesPerChunk) / Idx2.BitPlanesPerFile;
#define idx2_PrintLevel idx2_Print(&Pr, "/L%02x", Level);
#define idx2_PrintBrick                                                                            \
  for (int Depth = 0; Depth + 1 < Idx2.FilesDirsDepth[Level].Len; ++Depth)                         \
  {                                                                                                \
    int BitLen =                                                                                   \
      idx2_BitSizeOf(u64) - Idx2.BricksOrderStr[Level].Len + Idx2.FilesDirsDepth[Level][Depth];    \
    idx2_Print(&Pr, "/B%" PRIx64, TakeFirstBits(Brick, BitLen));                                   \
    Brick <<= Idx2.FilesDirsDepth[Level][Depth];                                                   \
    Shift += Idx2.FilesDirsDepth[Level][Depth];                                                    \
  }
#define idx2_PrintExtension idx2_Print(&Pr, ".bin");
  u64 BrickBackup = Brick;
  int Shift = 0;
  thread_local static char FilePath[256];
  printer Pr(FilePath, sizeof(FilePath));
  idx2_Print(&Pr, "%.*s/%s/%s/", Idx2.Dir.Size, Idx2.Dir.ConstPtr, Idx2.Name, Idx2.Field);
  idx2_PrintLevel;
  idx2_PrintBrick;
  idx2_PrintExtension;
  u64 FileId = GetFileAddress(Idx2, BrickBackup, Level, Subband, BpKey);
  return file_id{ stref{ FilePath, Pr.Size }, FileId };
#undef idx2_PrintLevel
#undef idx2_PrintBrick
#undef idx2_PrintSubband
#undef idx2_PrintBitPlane
#undef idx2_PrintExtension
}